

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_rp__skyline_find_min_y(nk_rp_context *c,nk_rp_node *first,int x0,int width,int *pwaste)

{
  ushort uVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  uVar1 = (ushort)c->width;
  uVar7 = (uint)uVar1;
  uVar4 = (uint)first;
  if ((int)uVar4 < (int)(uint)uVar1) {
    __assert_fail("first->x <= x0",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x29a5,
                  "int nk_rp__skyline_find_min_y(struct nk_rp_context *, struct nk_rp_node *, int, int, int *)"
                 );
  }
  if (uVar4 < **(ushort **)&c->align) {
    uVar2 = 0;
    iVar6 = 0;
    iVar5 = 0;
    while ((int)uVar7 < (int)(x0 + uVar4)) {
      uVar1 = *(ushort *)((long)&c->width + 2);
      uVar9 = (uint)uVar1;
      if (uVar2 < uVar1) {
        iVar3 = (uVar9 - uVar2) * iVar6;
        c = *(nk_rp_context **)&c->align;
        uVar8 = (uint)(ushort)c->width;
        uVar2 = uVar9;
        if ((int)uVar7 < (int)uVar4) {
          iVar10 = uVar8 - uVar4;
          uVar7 = uVar8;
        }
        else {
          iVar10 = uVar8 - uVar7;
          uVar7 = uVar8;
        }
      }
      else {
        c = *(nk_rp_context **)&c->align;
        uVar9 = (uint)(ushort)c->width;
        iVar3 = uVar9 - uVar7;
        iVar10 = x0 - iVar6;
        if (iVar3 + iVar6 <= x0) {
          iVar10 = iVar3;
        }
        iVar3 = (uVar2 - uVar1) * iVar10;
        uVar7 = uVar9;
      }
      iVar5 = iVar5 + iVar3;
      iVar6 = iVar6 + iVar10;
    }
    *(int *)CONCAT44(in_register_0000000c,width) = iVar5;
    return uVar2;
  }
  __assert_fail("node->next->x > x0",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x29a8,
                "int nk_rp__skyline_find_min_y(struct nk_rp_context *, struct nk_rp_node *, int, int, int *)"
               );
}

Assistant:

NK_INTERN int
nk_rp__skyline_find_min_y(struct nk_rp_context *c, struct nk_rp_node *first,
    int x0, int width, int *pwaste)
{
    struct nk_rp_node *node = first;
    int x1 = x0 + width;
    int min_y, visited_width, waste_area;
    NK_ASSERT(first->x <= x0);
    NK_UNUSED(c);

    NK_ASSERT(node->next->x > x0);
    /* we ended up handling this in the caller for efficiency */
    NK_ASSERT(node->x <= x0);

    min_y = 0;
    waste_area = 0;
    visited_width = 0;
    while (node->x < x1)
    {
        if (node->y > min_y) {
            /* raise min_y higher. */
            /* we've accounted for all waste up to min_y, */
            /* but we'll now add more waste for everything we've visited */
            waste_area += visited_width * (node->y - min_y);
            min_y = node->y;
            /* the first time through, visited_width might be reduced */
            if (node->x < x0)
            visited_width += node->next->x - x0;
            else
            visited_width += node->next->x - node->x;
        } else {
            /* add waste area */
            int under_width = node->next->x - node->x;
            if (under_width + visited_width > width)
            under_width = width - visited_width;
            waste_area += under_width * (min_y - node->y);
            visited_width += under_width;
        }
        node = node->next;
    }
    *pwaste = waste_area;
    return min_y;
}